

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O0

int high_bit_order(char *allowed)

{
  char ch_00;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int local_28;
  int neworder;
  int mask;
  int iStack_18;
  char ch;
  int k;
  int i;
  int order;
  char *allowed_local;
  
  k = -1;
  iStack_18 = 0;
  sVar3 = strlen(allowed);
  mask = (int)sVar3;
  while (mask = mask + -1, -1 < mask) {
    ch_00 = allowed[mask];
    iVar1 = ishexdigit(ch_00);
    if (iVar1 != 0) {
      uVar2 = hex2int(ch_00);
      if (uVar2 != 0) {
        if ((uVar2 & 8) == 0) {
          if ((uVar2 & 4) == 0) {
            if ((uVar2 & 2) == 0) {
              local_28 = iStack_18 + 1;
            }
            else {
              local_28 = iStack_18 + 2;
            }
          }
          else {
            local_28 = iStack_18 + 3;
          }
        }
        else {
          local_28 = iStack_18 + 4;
        }
        if (k < local_28) {
          k = local_28;
        }
      }
      iStack_18 = iStack_18 + 4;
    }
  }
  return k;
}

Assistant:

static int
high_bit_order(char *allowed)
{
	int order = -1;
	int i = 0;
	int k = strlen(allowed)-1;
	for (; k >= 0; --k) {
		char ch = allowed[k];
		if (!ishexdigit(ch))
			continue;
		int mask = hex2int(ch);
		if (mask) {
			int neworder;
			if (mask & 8)
				neworder = 4 + i;
			else if (mask & 4)
				neworder = 3 + i;
			else if (mask & 2)
				neworder = 2 + i;
			else
				neworder = 1 + i;
			if (neworder > order)
				order = neworder;
		}
		i += 4;
	}
	return order;
}